

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O0

size_t __thiscall
cali::CompressedSnapshotRecord::append
          (CompressedSnapshotRecord *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  ulong uVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  size_t sVar4;
  ulong local_c0;
  size_t i;
  size_t len;
  size_t blk;
  uchar tmp [120];
  size_t skipped;
  Variant *data_vec_local;
  cali_id_t *attr_vec_local;
  size_t n_local;
  CompressedSnapshotRecord *this_local;
  
  tmp[0x70] = '\0';
  tmp[0x71] = '\0';
  tmp[0x72] = '\0';
  tmp[0x73] = '\0';
  tmp[0x74] = '\0';
  tmp[0x75] = '\0';
  tmp[0x76] = '\0';
  tmp[0x77] = '\0';
  skipped = (size_t)data_vec;
  data_vec_local = (Variant *)attr_vec;
  n_local = (size_t)this;
  for (attr_vec_local = (cali_id_t *)n; attr_vec_local != (cali_id_t *)0x0;
      attr_vec_local = (cali_id_t *)((long)attr_vec_local - uVar1)) {
    puVar2 = std::min<unsigned_long>((unsigned_long *)&attr_vec_local,&m_blocksize);
    uVar1 = *puVar2;
    i = 0;
    for (local_c0 = 0; local_c0 < uVar1; local_c0 = local_c0 + 1) {
      sVar3 = vlenc_u64((&(data_vec_local->m_v).type_and_size)[local_c0],tmp + (i - 8));
      sVar4 = Variant::pack((Variant *)(skipped + local_c0 * 0x10),tmp + sVar3 + i + -8);
      i = sVar4 + sVar3 + i;
    }
    if ((this->m_num_imm + uVar1 < 0x80) &&
       (this->m_imm_pos + this->m_imm_len + i <= this->m_buffer_len)) {
      memcpy(this->m_buffer + this->m_imm_len + this->m_imm_pos,&blk,i);
      this->m_imm_len = i + this->m_imm_len;
      this->m_num_imm = uVar1 + this->m_num_imm;
      this->m_buffer[this->m_imm_pos] = this->m_buffer[this->m_imm_pos] + (char)uVar1;
    }
    else {
      tmp._112_8_ = uVar1 + tmp._112_8_;
    }
    this->m_needed_len = i + this->m_needed_len;
    data_vec_local = (Variant *)(&(data_vec_local->m_v).type_and_size + uVar1);
    skipped = uVar1 * 0x10 + skipped;
  }
  this->m_skipped = tmp._112_8_ + this->m_skipped;
  sVar3._0_1_ = tmp[0x70];
  sVar3._1_1_ = tmp[0x71];
  sVar3._2_1_ = tmp[0x72];
  sVar3._3_1_ = tmp[0x73];
  sVar3._4_1_ = tmp[0x74];
  sVar3._5_1_ = tmp[0x75];
  sVar3._6_1_ = tmp[0x76];
  sVar3._7_1_ = tmp[0x77];
  return sVar3;
}

Assistant:

inline uint64_t vldec_u64(const unsigned char* buf, size_t* inc)
{
    uint64_t val = 0;
    size_t   p   = 0;

    for (; p < 9 && (buf[p] & 0x80); ++p)
        val |= ((uint64_t) (buf[p] & 0x7F) << (7 * p));

    val |= ((uint64_t) (buf[p] & 0x7F) << (7 * p));
    ++p;

    *inc += p;

    return val;
}